

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O3

void duckdb::FixedSizeScanPartial<short>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  idx_t iVar1;
  idx_t iVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  pointer pSVar5;
  
  pSVar5 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  iVar1 = state->row_index;
  iVar2 = (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar5 + 3));
  p_Var3 = pSVar5[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  Vector::SetVectorType(result,FLAT_VECTOR);
  switchD_012b9b0d::default
            (result->data + result_offset * 2,p_Var3 + (iVar1 - iVar2) * 2 + iVar4,scan_count * 2);
  return;
}

Assistant:

void FixedSizeScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                          idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<FixedSizeScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto source_data = data + start * sizeof(T);

	// copy the data from the base table
	result.SetVectorType(VectorType::FLAT_VECTOR);
	memcpy(FlatVector::GetData(result) + result_offset * sizeof(T), source_data, scan_count * sizeof(T));
}